

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O1

bool BmsUtil::utf8_to_wchar(char *org,wchar_t *out,int maxlen)

{
  iconv_t __cd;
  size_t sVar1;
  bool bVar2;
  char *but_out_iconv;
  size_t len_out;
  size_t len_in;
  ICONVCHR *buf_iconv;
  wchar_t *local_50;
  size_t local_48;
  size_t local_40;
  char *local_38;
  
  __cd = iconv_open("UTF-16LE","UTF-8");
  if (__cd == (iconv_t)0xffffffffffffffff) {
    bVar2 = false;
  }
  else {
    *out = L'\0';
    local_50 = out;
    local_38 = org;
    local_40 = strlen(org);
    local_48 = (size_t)(maxlen * 2);
    sVar1 = iconv(__cd,&local_38,&local_40,(char **)&local_50,&local_48);
    bVar2 = (sVar1 & 0xffffffff) != 0xffffffff;
    if (bVar2) {
      *(undefined1 *)((long)local_50 + 1) = 0;
      *(undefined1 *)local_50 = 0;
    }
  }
  return bVar2;
}

Assistant:

bool BmsUtil::utf8_to_wchar(const char *org, wchar_t *out, int maxlen)
{
	iconv_t cd = iconv_open("UTF-16LE", "UTF-8");
	if (cd == (void*)-1)
		return false;

	out[0] = 0;
	ICONVCHR *buf_iconv = (ICONVCHR*)org;
	char *but_out_iconv = (char*)out;
	size_t len_in = strlen(org);
	size_t len_out = maxlen * 2;

	int r = iconv(cd, &buf_iconv, &len_in, &but_out_iconv, &len_out);
	if ((int)r == -1)
		return false;
	*but_out_iconv = *(but_out_iconv + 1) = 0;

	return true;
}